

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskscheduler.cpp
# Opt level: O2

void __thiscall TaskScheduler::start(TaskScheduler *this)

{
  size_type sVar1;
  int iVar2;
  int i;
  long lVar3;
  int n;
  long *local_c0;
  int finished;
  int total;
  thread local_b0;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  mutex ex;
  mutex ex2;
  
  sVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                    ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)this
                    );
  total = (int)sVar1;
  finished = 0;
  n = std::thread::hardware_concurrency();
  github111116::ConsoleLogger::info<char[25],int,char[8]>
            (&console,(char (*) [25])"Scheduler: Starting with",&n,(char (*) [8])"threads");
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ex.super___mutex_base._M_mutex._16_8_ = 0;
  ex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  ex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ex.super___mutex_base._M_mutex.__align = 0;
  ex.super___mutex_base._M_mutex._8_8_ = 0;
  ex2.super___mutex_base._M_mutex._16_8_ = 0;
  ex2.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  ex2.super___mutex_base._M_mutex.__align = 0;
  ex2.super___mutex_base._M_mutex._8_8_ = 0;
  ex2.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  for (iVar2 = 0; iVar2 < n; iVar2 = iVar2 + 1) {
    local_b0._M_id._M_thread = (id)0;
    local_c0 = (long *)operator_new(0x30);
    *local_c0 = (long)&PTR___State_001605e8;
    local_c0[1] = (long)&ex;
    local_c0[2] = (long)this;
    local_c0[3] = (long)&ex2;
    local_c0[4] = (long)&finished;
    local_c0[5] = (long)&total;
    std::thread::_M_start_thread(&local_b0,&local_c0,0);
    if (local_c0 != (long *)0x0) {
      (**(code **)(*local_c0 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&threads,&local_b0);
    std::thread::~thread(&local_b0);
  }
  for (lVar3 = 0; lVar3 < n; lVar3 = lVar3 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return;
}

Assistant:

void TaskScheduler::start()
{
	int total = tasks.size();
	int finished = 0;
#ifndef SINGLE_THREADED
	int n = std::thread::hardware_concurrency();
	console.info("Scheduler: Starting with", n, "threads");
	std::vector<std::thread> threads;
	std::mutex ex,ex2;
	auto work = [&](){
		try {
			while (1) {
				task_t task = NULL;
				ex.lock();
				if (!tasks.empty()) {
					task = tasks.front();
					tasks.pop();
				}
				ex.unlock();
				if (task == NULL) break;
				task();
				if (onprogress) {
					ex2.lock();
					finished += 1;
					onprogress(finished, total);
					ex2.unlock();
				}
			}
		}
		catch (const char* err) {
			console.error(err);
			throw err;
		}
	};
	for (int i=0; i<n; ++i)
		threads.push_back(std::thread(work));
	for (int i=0; i<n; ++i)
		threads[i].join();
#else
	console.warn("Scheduler: Starting single threaded");
	while (!tasks.empty()) {
		task_t task = tasks.front();
		tasks.pop();
		task();
		if (onprogress) {
			finished += 1;
			onprogress(finished, total);
		}
	}
#endif
}